

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp)

{
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  stbi_uc *psVar7;
  stbi_uc *psVar8;
  int local_74;
  stbi__context *psStack_50;
  int len;
  stbi_uc *o;
  stbi__int32 h;
  stbi__int32 w;
  stbi__int32 y;
  stbi__int32 x;
  stbi_uc *old_out;
  int i;
  int req_comp_local;
  int *comp_local;
  stbi__gif *g_local;
  stbi__context *s_local;
  
  if (g->out == (stbi_uc *)0x0) {
    iVar3 = stbi__gif_header(s,g,comp,0);
    if (iVar3 == 0) {
      return (stbi_uc *)0x0;
    }
    psVar7 = (stbi_uc *)stbi__malloc((long)(g->w * 4 * g->h));
    g->out = psVar7;
    if (g->out == (stbi_uc *)0x0) {
      stbi__err("outofmem");
      return (stbi_uc *)0x0;
    }
    stbi__fill_gif_background(g);
  }
  else if ((int)(g->eflags & 0x1cU) >> 2 == 3) {
    psVar7 = g->out;
    psVar8 = (stbi_uc *)stbi__malloc((long)(g->w * 4 * g->h));
    g->out = psVar8;
    if (g->out == (stbi_uc *)0x0) {
      stbi__err("outofmem");
      return (stbi_uc *)0x0;
    }
    memcpy(g->out,psVar7,(long)(g->w * g->h * 4));
  }
  do {
    while( true ) {
      sVar1 = stbi__get8(s);
      if (sVar1 != '!') {
        if (sVar1 == ',') {
          iVar3 = stbi__get16le(s);
          iVar4 = stbi__get16le(s);
          iVar5 = stbi__get16le(s);
          iVar6 = stbi__get16le(s);
          if ((g->w < iVar3 + iVar5) || (g->h < iVar4 + iVar6)) {
            stbi__err("bad Image Descriptor");
            s_local = (stbi__context *)0x0;
          }
          else {
            g->line_size = g->w << 2;
            g->start_x = iVar3 << 2;
            g->start_y = iVar4 * g->line_size;
            g->max_x = g->start_x + iVar5 * 4;
            g->max_y = g->start_y + iVar6 * g->line_size;
            g->cur_x = g->start_x;
            g->cur_y = g->start_y;
            bVar2 = stbi__get8(s);
            g->lflags = (uint)bVar2;
            if ((g->lflags & 0x40U) == 0) {
              g->step = g->line_size;
              g->parse = 0;
            }
            else {
              g->step = g->line_size << 3;
              g->parse = 3;
            }
            if ((g->lflags & 0x80U) == 0) {
              if ((g->flags & 0x80U) == 0) {
                stbi__err("missing color table");
                return (stbi_uc *)0x0;
              }
              for (old_out._0_4_ = 0; (int)old_out < 0x100; old_out._0_4_ = (int)old_out + 1) {
                g->pal[(int)old_out][3] = 0xff;
              }
              if ((-1 < g->transparent) && ((g->eflags & 1U) != 0)) {
                g->pal[g->transparent][3] = '\0';
              }
              g->color_table = g->pal[0];
            }
            else {
              if ((g->eflags & 1U) == 0) {
                local_74 = -1;
              }
              else {
                local_74 = g->transparent;
              }
              stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)g->lflags & 7),local_74);
              g->color_table = g->lpal[0];
            }
            psStack_50 = (stbi__context *)stbi__process_gif_raster(s,g);
            if (psStack_50 == (stbi__context *)0x0) {
              s_local = (stbi__context *)0x0;
            }
            else {
              if ((req_comp != 0) && (req_comp != 4)) {
                psStack_50 = (stbi__context *)
                             stbi__convert_format((uchar *)psStack_50,4,req_comp,g->w,g->h);
              }
              s_local = psStack_50;
            }
          }
        }
        else {
          s_local = s;
          if (sVar1 != ';') {
            stbi__err("unknown code");
            s_local = (stbi__context *)0x0;
          }
        }
        return (stbi_uc *)s_local;
      }
      sVar1 = stbi__get8(s);
      if (sVar1 == 0xf9) break;
LAB_0013546d:
      while( true ) {
        bVar2 = stbi__get8(s);
        if (bVar2 == 0) break;
        stbi__skip(s,(uint)bVar2);
      }
    }
    bVar2 = stbi__get8(s);
    if (bVar2 == 4) {
      bVar2 = stbi__get8(s);
      g->eflags = (uint)bVar2;
      stbi__get16le(s);
      bVar2 = stbi__get8(s);
      g->transparent = (uint)bVar2;
      goto LAB_0013546d;
    }
    stbi__skip(s,(uint)bVar2);
  } while( true );
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp)
{
   int i;
   stbi_uc *old_out = 0;

   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0))     return 0; // stbi__g_failure_reason set by stbi__gif_header
      g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
      if (g->out == 0)                      return stbi__errpuc("outofmem", "Out of memory");
      stbi__fill_gif_background(g);
   } else {
      // animated-gif-only path
      if (((g->eflags & 0x1C) >> 2) == 3) {
         old_out = g->out;
         g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
         if (g->out == 0)                   return stbi__errpuc("outofmem", "Out of memory");
         memcpy(g->out, old_out, g->w*g->h*4);
      }
   }

   for (;;) {
      switch (stbi__get8(s)) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               for (i=0; i < 256; ++i)  // @OPTIMIZE: stbi__jpeg_reset only the previous transparent
                  g->pal[i][3] = 255;
               if (g->transparent >= 0 && (g->eflags & 0x01))
                  g->pal[g->transparent][3] = 0;
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (o == NULL) return NULL;

            if (req_comp && req_comp != 4)
               o = stbi__convert_format(o, 4, req_comp, g->w, g->h);
            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            if (stbi__get8(s) == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  stbi__get16le(s); // delay
                  g->transparent = stbi__get8(s);
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0)
               stbi__skip(s, len);
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}